

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_test.cpp
# Opt level: O2

void __thiscall license::test::extend_license::test_method(extend_license *this)

{
  bool bVar1;
  char *pcVar2;
  allocator local_369;
  undefined1 local_368 [16];
  undefined1 auStack_358 [16];
  undefined1 local_348 [16];
  undefined1 auStack_338 [16];
  string new_date;
  path licFile;
  undefined1 local_2e8 [32];
  _Rb_tree_node_base local_2c8;
  size_t local_2a8;
  _List_node_base local_2a0;
  undefined7 local_290;
  undefined4 uStack_289;
  bool local_285;
  int local_284;
  allocator local_278 [8];
  undefined8 local_270;
  shared_count sStack_268;
  string lic_location_str;
  License license_renew;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  License license;
  
  boost::filesystem::path::path((path *)&license,"myclient.lic");
  boost::filesystem::operator/(&licFile,(path *)MyGlobalFixture::licenses_path,(path *)&license);
  std::__cxx11::string::~string((string *)&license);
  std::__cxx11::string::string((string *)&lic_location_str,(string *)&licFile);
  License::License(&license,&lic_location_str,(string *)MyGlobalFixture::project_path,false);
  std::__cxx11::string::string((string *)&license_renew,"valid-to",(allocator *)&new_date);
  std::__cxx11::string::string((string *)local_2e8,"1929-11-11",(allocator *)local_368);
  License::add_parameter(&license,(string *)&license_renew,(string *)local_2e8);
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::~string((string *)&license_renew);
  std::__cxx11::string::string((string *)&license_renew,"client-signature",(allocator *)&new_date);
  std::__cxx11::string::string((string *)local_2e8,"XXX-XXX-XXX",(allocator *)local_368);
  License::add_parameter(&license,(string *)&license_renew,(string *)local_2e8);
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::~string((string *)&license_renew);
  License::write_license(&license);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x85);
  bVar1 = boost::filesystem::exists(&licFile);
  local_2e8[0] = bVar1;
  local_2e8._8_8_ = 0;
  local_2e8._16_8_ = 0;
  license_renew.m_private_key._M_dataplus._M_p._0_1_ = 0;
  license_renew._vptr_License = (_func_int **)&PTR__lazy_ostream_0054cc88;
  license_renew.m_private_key._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  license_renew.m_private_key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_e8af;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_100 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_2e8 + 0x10));
  local_2c8._M_left = &local_2c8;
  local_2c8._M_color = _S_red;
  local_2c8._M_parent = (_Base_ptr)0x0;
  local_2e8._0_8_ = (pointer)0x0;
  local_2e8._8_8_ = 0;
  local_2e8._16_8_ = 0;
  local_2a8 = 0;
  local_2a0._M_next = &local_2a0;
  local_290 = 0;
  uStack_289 = 0;
  local_285 = true;
  local_284 = 0;
  local_2c8._M_right = local_2c8._M_left;
  local_2a0._M_prev = local_2a0._M_next;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_2e8,
             licFile.m_pathname._M_dataplus._M_p);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x88);
  pcVar2 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                     ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_2e8
                      ,"TEST_PROJECT","valid-to",(char *)0x0,(bool *)0x0);
  std::__cxx11::string::string((string *)&license_renew,pcVar2,(allocator *)local_348);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &license_renew,"1929-11-11");
  local_368[0] = bVar1;
  local_368._8_8_ = 0;
  auStack_358._0_8_ = (sp_counted_base *)0x0;
  new_date._M_string_length._0_1_ = 0;
  new_date._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0054cdc8;
  new_date.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  new_date.field_2._8_8_ = anon_var_dwarf_ea8c;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_130 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)auStack_358);
  std::__cxx11::string::~string((string *)&license_renew);
  License::License(&license_renew,&lic_location_str,(string *)MyGlobalFixture::project_path,false);
  std::__cxx11::string::string((string *)&new_date,"2020-05-01",(allocator *)local_368);
  std::__cxx11::string::string((string *)local_368,"valid-to",local_278);
  std::__cxx11::string::string((string *)local_348,new_date._M_dataplus._M_p,&local_369);
  License::add_parameter(&license_renew,(string *)local_368,(string *)local_348);
  std::__cxx11::string::~string((string *)local_348);
  std::__cxx11::string::~string((string *)local_368);
  License::write_license(&license_renew);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Reset
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_2e8);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_2e8,
             licFile.m_pathname._M_dataplus._M_p);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x90);
  pcVar2 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                     ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_2e8
                      ,"TEST_PROJECT","valid-to",(char *)0x0,(bool *)0x0);
  bVar1 = std::operator==(pcVar2,&new_date);
  local_348[0] = bVar1;
  local_348._8_8_ = 0;
  auStack_338._0_8_ = 0;
  local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
  local_368._0_8_ = &PTR__lazy_ostream_0054cdc8;
  auStack_358._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_358._8_8_ = "license extended";
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_160 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)auStack_338);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_170 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x92);
  pcVar2 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                     ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_2e8
                      ,"TEST_PROJECT","client-signature",(char *)0x0,(bool *)0x0);
  std::__cxx11::string::string((string *)local_368,"XXX-XXX-XXX",&local_369);
  local_278[0] = (allocator)
                 std::operator==(pcVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_368);
  local_270 = 0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_348._8_8_ = local_348._8_8_ & 0xffffffffffffff00;
  local_348._0_8_ = &PTR__lazy_ostream_0054cdc8;
  auStack_338._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_338._8_8_ = "license extended";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_268);
  std::__cxx11::string::~string((string *)local_368);
  std::__cxx11::string::~string((string *)&new_date);
  License::~License(&license_renew);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_2e8);
  License::~License(&license);
  std::__cxx11::string::~string((string *)&lic_location_str);
  std::__cxx11::string::~string((string *)&licFile);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(extend_license) {
	const fs::path licFile = MyGlobalFixture::licenses_path / "myclient.lic";
	const string lic_location_str = licFile.string();
	License license(&lic_location_str, MyGlobalFixture::project_path.string());
	license.add_parameter(PARAM_EXPIRY_DATE, "1929-11-11");
	license.add_parameter(PARAM_CLIENT_SIGNATURE, "XXX-XXX-XXX");
	license.write_license();
	BOOST_REQUIRE_MESSAGE(fs::exists(licFile), "license has been created");
	CSimpleIniA ini;
	ini.LoadFile(licFile.c_str());
	BOOST_CHECK_MESSAGE(string(ini.GetValue("TEST_PROJECT", PARAM_EXPIRY_DATE)) == "1929-11-11", "Date was written");

	License license_renew(&lic_location_str, MyGlobalFixture::project_path.string());
	const string new_date("2020-05-01");
	license_renew.add_parameter(PARAM_EXPIRY_DATE, new_date.c_str());
	license_renew.write_license();
	ini.Reset();
	ini.LoadFile(licFile.c_str());
	BOOST_CHECK_MESSAGE(ini.GetValue("TEST_PROJECT", PARAM_EXPIRY_DATE) == new_date, "license extended");
	BOOST_CHECK_MESSAGE(ini.GetValue("TEST_PROJECT", PARAM_CLIENT_SIGNATURE) == string("XXX-XXX-XXX"),
						"license extended");
}